

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

int Curl_pgrsUpdate(Curl_easy *data)

{
  FILE *whereto;
  undefined1 auVar1 [12];
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  timediff_t tVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  curl_off_t seconds;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  curltime cVar17;
  curltime older;
  curltime newer;
  curltime newer_00;
  long local_a8;
  long local_a0;
  char local_96 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  cVar17 = Curl_now();
  lVar12 = cVar17.tv_sec;
  uVar2 = (data->progress).start.tv_sec;
  uVar3 = (data->progress).start.tv_usec;
  older.tv_usec = uVar3;
  older.tv_sec = uVar2;
  older._12_4_ = 0;
  auVar1 = cVar17._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar1._0_8_;
  newer.tv_usec = auVar1._8_4_;
  uVar5 = Curl_timediff_us(newer,older);
  (data->progress).timespent = uVar5;
  uVar13 = (data->progress).downloaded;
  if ((long)uVar5 < 1) {
    uVar6 = uVar13 * 1000000;
    (data->progress).dlspeed = uVar6;
    uVar15 = (data->progress).uploaded;
    uVar10 = uVar15 * 1000000;
  }
  else {
    uVar10 = 0x7fffffffffffffff;
    if ((long)uVar13 < 0x8637bd05af6) {
      uVar6 = (long)(uVar13 * 1000000) / (long)uVar5;
    }
    else {
      uVar6 = 0x7fffffffffffffff;
      if (999999 < uVar5) {
        uVar6 = uVar13 / (uVar5 / 1000000);
      }
    }
    (data->progress).dlspeed = uVar6;
    uVar15 = (data->progress).uploaded;
    if ((long)uVar15 < 0x8637bd05af6) {
      uVar10 = (long)(uVar15 * 1000000) / (long)uVar5;
    }
    else if (999999 < uVar5) {
      uVar10 = uVar15 / (uVar5 / 1000000);
    }
  }
  (data->progress).ulspeed = uVar10;
  lVar9 = (data->progress).lastshow;
  if (lVar9 != lVar12) {
    iVar4 = (data->progress).speeder_c;
    iVar16 = iVar4 % 6;
    (data->progress).lastshow = lVar12;
    (data->progress).speeder[iVar16] = uVar15 + uVar13;
    (data->progress).speeder_time[iVar16].tv_sec = lVar12;
    (data->progress).speeder_time[iVar16].tv_usec = cVar17.tv_usec;
    (data->progress).speeder_c = iVar4 + 1U;
    if (iVar4 == 0) {
      lVar11 = uVar10 + uVar6;
    }
    else {
      uVar13 = 0;
      if (4 < iVar4) {
        uVar13 = (ulong)((iVar4 + 1U) % 6);
      }
      uVar5 = (ulong)(uint)((int)uVar13 << 4);
      cVar17.tv_usec = *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + uVar5);
      cVar17.tv_sec = *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + uVar5);
      cVar17._12_4_ = 0;
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar1._0_8_;
      newer_00.tv_usec = auVar1._8_4_;
      tVar7 = Curl_timediff(newer_00,cVar17);
      lVar11 = tVar7 + (ulong)(tVar7 == 0);
      lVar8 = (data->progress).speeder[iVar16] - (data->progress).speeder[uVar13];
      if (lVar8 < 0x418938) {
        lVar11 = (lVar8 * 1000) / lVar11;
      }
      else {
        lVar11 = (long)((double)lVar8 / ((double)lVar11 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar11;
  }
  if (((data->progress).flags & 0x10) != 0) {
    return 0;
  }
  if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
    if ((data->set).fprogress != (curl_progress_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar4 = (*(data->set).fprogress)
                        ((data->set).progress_client,(double)(data->progress).size_dl,
                         (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                         (double)(data->progress).uploaded);
      goto LAB_005a0942;
    }
  }
  else {
    Curl_set_in_callback(data,true);
    iVar4 = (*(data->set).fxferinfo)
                      ((data->set).progress_client,(data->progress).size_dl,
                       (data->progress).downloaded,(data->progress).size_ul,
                       (data->progress).uploaded);
LAB_005a0942:
    Curl_set_in_callback(data,false);
    if (iVar4 == 0) {
      return 0;
    }
    if (iVar4 != 0x10000001) {
      Curl_failf(data,"Callback aborted");
      return iVar4;
    }
  }
  if (lVar9 == lVar12) {
    return 0;
  }
  lVar12 = (data->progress).timespent;
  uVar14 = (data->progress).flags;
  if (-1 < (char)uVar14) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar14 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar14;
  }
  lVar12 = lVar12 / 1000000;
  if (((uVar14 & 0x20) == 0) || (lVar9 = (data->progress).ulspeed, lVar9 < 1)) {
    lVar9 = 0;
LAB_005a0a4f:
    local_a0 = 0;
  }
  else {
    uVar13 = (data->progress).size_ul;
    lVar9 = (long)uVar13 / lVar9;
    if ((long)uVar13 < 0x2711) {
      if ((long)uVar13 < 1) goto LAB_005a0a4f;
      local_a0 = (data->progress).uploaded * 100;
    }
    else {
      local_a0 = (data->progress).uploaded;
      uVar13 = uVar13 / 100;
    }
    local_a0 = local_a0 / (long)uVar13;
  }
  if (((uVar14 & 0x40) == 0) || (lVar11 = (data->progress).dlspeed, lVar11 < 1)) {
    lVar11 = 0;
LAB_005a0acb:
    local_a8 = 0;
  }
  else {
    uVar13 = (data->progress).size_dl;
    lVar11 = (long)uVar13 / lVar11;
    if ((long)uVar13 < 0x2711) {
      if ((long)uVar13 < 1) goto LAB_005a0acb;
      local_a8 = (data->progress).downloaded * 100;
    }
    else {
      local_a8 = (data->progress).downloaded;
      uVar13 = uVar13 / 100;
    }
    local_a8 = local_a8 / (long)uVar13;
  }
  if (lVar11 < lVar9) {
    lVar11 = lVar9;
  }
  seconds = 0;
  if (0 < lVar11) {
    seconds = lVar11 - lVar12;
  }
  time2str(time_left,seconds);
  time2str(time_total,lVar11);
  time2str(local_96,lVar12);
  uVar14 = (data->progress).flags;
  uVar13 = (&(data->progress).size_dl)[(ulong)((uVar14 & 0x40) == 0) * 2] +
           (&(data->progress).size_ul)[(ulong)((uVar14 & 0x20) == 0) * 2];
  lVar12 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar13 < 0x2711) {
    if ((long)uVar13 < 1) {
      lVar12 = 0;
    }
    else {
      lVar12 = (lVar12 * 100) / (long)uVar13;
    }
  }
  else {
    lVar12 = lVar12 / (long)(uVar13 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar13,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar12,max5 + 2,local_a8,
                max5,local_a0,max5 + 1,max5 + 3,max5 + 4,time_total,local_96,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct Curl_easy *data)
{
  struct curltime now = Curl_now(); /* what time is it */
  bool showprogress = progress_calc(data, now);
  if(!(data->progress.flags & PGRS_HIDE)) {
    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }
    else if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }

    if(showprogress)
      progress_meter(data);
  }

  return 0;
}